

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

int32_t ucptrie_toBinary_63(UCPTrie *trie,void *data,int32_t capacity,UErrorCode *pErrorCode)

{
  char cVar1;
  UBool UVar2;
  void *__dest;
  UCPTrieHeader *header;
  char *bytes;
  int32_t length;
  UCPTrieValueWidth valueWidth;
  UCPTrieType type;
  UErrorCode *pErrorCode_local;
  int32_t capacity_local;
  void *data_local;
  UCPTrie *trie_local;
  
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 == '\0') {
    cVar1 = trie->valueWidth;
    if (((((trie->type < '\0') || ('\x01' < trie->type)) || (cVar1 < '\0')) ||
        (('\x02' < cVar1 || (capacity < 0)))) ||
       ((0 < capacity && ((data == (void *)0x0 || (((ulong)data & 3) != 0)))))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      trie_local._4_4_ = 0;
    }
    else {
      bytes._4_4_ = trie->indexLength * 2 + 0x10;
      if (cVar1 == '\0') {
        bytes._4_4_ = trie->dataLength * 2 + bytes._4_4_;
      }
      else if (cVar1 == '\x01') {
        bytes._4_4_ = trie->dataLength * 4 + bytes._4_4_;
      }
      else if (cVar1 == '\x02') {
        bytes._4_4_ = trie->dataLength + bytes._4_4_;
      }
      if (capacity < bytes._4_4_) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        trie_local._4_4_ = bytes._4_4_;
      }
      else {
        *(undefined4 *)data = 0x54726933;
        *(ushort *)((long)data + 4) =
             (ushort)((trie->dataLength & 0xf0000U) >> 4) |
             (ushort)((uint)trie->dataNullOffset >> 8) & 0xf00 | (short)trie->type << 6 |
             (short)cVar1;
        *(short *)((long)data + 6) = (short)trie->indexLength;
        *(short *)((long)data + 8) = (short)trie->dataLength;
        *(uint16_t *)((long)data + 10) = trie->index3NullOffset;
        *(short *)((long)data + 0xc) = (short)trie->dataNullOffset;
        *(short *)((long)data + 0xe) = (short)((uint)trie->highStart >> 9);
        memcpy((void *)((long)data + 0x10),trie->index,(long)(trie->indexLength * 2));
        __dest = (void *)((long)data + 0x10 + (long)(trie->indexLength * 2));
        if (cVar1 == '\0') {
          memcpy(__dest,(trie->data).ptr0,(long)(trie->dataLength << 1));
        }
        else if (cVar1 == '\x01') {
          memcpy(__dest,(trie->data).ptr0,(long)(trie->dataLength << 2));
        }
        else if (cVar1 == '\x02') {
          memcpy(__dest,(trie->data).ptr0,(long)trie->dataLength);
        }
        trie_local._4_4_ = bytes._4_4_;
      }
    }
  }
  else {
    trie_local._4_4_ = 0;
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_toBinary(const UCPTrie *trie,
                 void *data, int32_t capacity,
                 UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return 0;
    }

    UCPTrieType type = (UCPTrieType)trie->type;
    UCPTrieValueWidth valueWidth = (UCPTrieValueWidth)trie->valueWidth;
    if (type < UCPTRIE_TYPE_FAST || UCPTRIE_TYPE_SMALL < type ||
            valueWidth < UCPTRIE_VALUE_BITS_16 || UCPTRIE_VALUE_BITS_8 < valueWidth ||
            capacity < 0 ||
            (capacity > 0 && (data == nullptr || (U_POINTER_MASK_LSB(data, 3) != 0)))) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t length = (int32_t)sizeof(UCPTrieHeader) + trie->indexLength * 2;
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        length += trie->dataLength * 2;
        break;
    case UCPTRIE_VALUE_BITS_32:
        length += trie->dataLength * 4;
        break;
    case UCPTRIE_VALUE_BITS_8:
        length += trie->dataLength;
        break;
    default:
        // unreachable
        break;
    }
    if (capacity < length) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }

    char *bytes = (char *)data;
    UCPTrieHeader *header = (UCPTrieHeader *)bytes;
    header->signature = UCPTRIE_SIG;  // "Tri3"
    header->options = (uint16_t)(
        ((trie->dataLength & 0xf0000) >> 4) |
        ((trie->dataNullOffset & 0xf0000) >> 8) |
        (trie->type << 6) |
        valueWidth);
    header->indexLength = (uint16_t)trie->indexLength;
    header->dataLength = (uint16_t)trie->dataLength;
    header->index3NullOffset = trie->index3NullOffset;
    header->dataNullOffset = (uint16_t)trie->dataNullOffset;
    header->shiftedHighStart = trie->highStart >> UCPTRIE_SHIFT_2;
    bytes += sizeof(UCPTrieHeader);

    uprv_memcpy(bytes, trie->index, trie->indexLength * 2);
    bytes += trie->indexLength * 2;

    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        uprv_memcpy(bytes, trie->data.ptr16, trie->dataLength * 2);
        break;
    case UCPTRIE_VALUE_BITS_32:
        uprv_memcpy(bytes, trie->data.ptr32, trie->dataLength * 4);
        break;
    case UCPTRIE_VALUE_BITS_8:
        uprv_memcpy(bytes, trie->data.ptr8, trie->dataLength);
        break;
    default:
        // unreachable
        break;
    }
    return length;
}